

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int remainingElementsCount_add(JSContext *ctx,JSValue resolve_element_env,int addend)

{
  JSValue val_00;
  JSValue this_obj;
  JSValue val_01;
  int iVar1;
  uint32_t idx;
  int in_ECX;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSValueUnion in_RDI;
  JSValue JVar2;
  int remainingElementsCount;
  JSValue val;
  JSValueUnion ctx_00;
  undefined1 in_stack_ffffffffffffff98 [16];
  int64_t iVar3;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int64_t in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 local_20;
  
  JVar2.u._4_4_ = in_stack_ffffffffffffffac;
  JVar2.u.int32 = in_stack_ffffffffffffffa8;
  JVar2.tag = in_stack_ffffffffffffffb0;
  JVar2 = JS_GetPropertyUint32
                    (in_stack_ffffffffffffff98._8_8_,JVar2,in_stack_ffffffffffffff98._4_4_);
  ctx_00 = JVar2.u;
  iVar3 = JVar2.tag;
  iVar1 = JS_IsException(JVar2);
  if (iVar1 == 0) {
    val_01.tag = in_RDX;
    val_01.u.ptr = in_RSI.ptr;
    iVar1 = JS_ToInt32Free((JSContext *)in_RDI.ptr,
                           (int32_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffc0),val_01);
    if (iVar1 == 0) {
      idx = in_stack_ffffffffffffffac + in_ECX;
      this_obj.tag = (int64_t)in_RSI.ptr;
      this_obj.u.ptr = in_RDI.ptr;
      val_00.tag._0_4_ = in_stack_ffffffffffffffc0;
      val_00.u = (JSValueUnion)iVar3;
      val_00.tag._4_4_ = in_ECX;
      iVar1 = JS_SetPropertyUint32((JSContext *)ctx_00.ptr,this_obj,idx,val_00);
      if (iVar1 < 0) {
        local_20 = 0xffffffff;
      }
      else {
        local_20 = (uint)(idx == 0);
      }
    }
    else {
      local_20 = 0xffffffff;
    }
  }
  else {
    local_20 = 0xffffffff;
  }
  return local_20;
}

Assistant:

static __exception int remainingElementsCount_add(JSContext *ctx,
                                                  JSValueConst resolve_element_env,
                                                  int addend)
{
    JSValue val;
    int remainingElementsCount;

    val = JS_GetPropertyUint32(ctx, resolve_element_env, 0);
    if (JS_IsException(val))
        return -1;
    if (JS_ToInt32Free(ctx, &remainingElementsCount, val))
        return -1;
    remainingElementsCount += addend;
    if (JS_SetPropertyUint32(ctx, resolve_element_env, 0,
                             JS_NewInt32(ctx, remainingElementsCount)) < 0)
        return -1;
    return (remainingElementsCount == 0);
}